

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stunmsg_unittest.cc
# Opt level: O1

void anon_unknown.dwarf_24059::PrintWord(uint8_t *v,size_t size,ostream *out)

{
  ostream *poVar1;
  long lVar2;
  ostream oVar3;
  size_t sVar4;
  
  if (size != 0) {
    sVar4 = 0;
    do {
      if (sVar4 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
      }
      poVar1 = out + *(long *)(*(long *)out + -0x18);
      if (out[*(long *)(*(long *)out + -0x18) + 0xe1] == (ostream)0x0) {
        oVar3 = (ostream)std::ios::widen((char)poVar1);
        poVar1[0xe0] = oVar3;
        poVar1[0xe1] = (ostream)0x1;
      }
      poVar1[0xe0] = (ostream)0x30;
      lVar2 = *(long *)out;
      *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 2;
      lVar2 = *(long *)(lVar2 + -0x18);
      *(uint *)(out + lVar2 + 0x18) = *(uint *)(out + lVar2 + 0x18) & 0xffffffb5 | 8;
      std::ostream::operator<<((ostream *)out,(uint)v[sVar4]);
      sVar4 = sVar4 + 1;
    } while (size != sVar4);
  }
  return;
}

Assistant:

void PrintWord(const uint8_t *v, size_t size, std::ostream &out) {
  size_t i;
  for (i = 0; i < size; i++) {
    if (i > 0)
      out << " ";
    out << std::setfill('0')
        << std::setw(2)
        << std::hex
        << (int)v[i];
  }
}